

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O1

FString SubstituteAliasParams(FString *command,FCommandLine *args)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  FCommandLine *in_RDX;
  char *pcVar6;
  char *pcVar7;
  char *tail;
  long lVar8;
  char *start;
  char *local_48;
  FCommandLine *local_40;
  FCommandLine *local_38;
  
  local_40 = in_RDX;
  local_38 = args;
  pcVar4 = FString::LockBuffer((FString *)args);
  command->Chars = (char *)0x727dbc;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  local_48 = pcVar4;
  do {
    bVar2 = false;
LAB_00358f01:
    pcVar6 = pcVar4 + 1;
    lVar8 = 0;
    tail = local_48;
    pcVar7 = pcVar4;
    while( true ) {
      cVar1 = pcVar4[lVar8];
      if (cVar1 == '%') {
        if ((pcVar4[lVar8 + 1] == '{') || ((byte)(pcVar4[lVar8 + 1] - 0x30U) < 10)) {
          FString::AppendCStrPart(command,local_48,(size_t)(pcVar4 + (lVar8 - (long)local_48)));
          uVar5 = strtoul(pcVar4 + (ulong)(pcVar4[lVar8 + 1] == '{') + lVar8 + 1,&local_48,10);
          if (((pcVar4[lVar8 + 1] != '{') || (*local_48 == '}')) &&
             (iVar3 = FCommandLine::argc(local_40), uVar5 < (ulong)(long)iVar3)) {
            pcVar6 = FCommandLine::operator[](local_40,(int)uVar5);
            FString::operator+=(command,pcVar6);
          }
          if (pcVar4[lVar8 + 1] == '{') {
            uVar5 = (ulong)(*local_48 == '}');
          }
          else {
            uVar5 = 0;
          }
          local_48 = local_48 + uVar5;
          pcVar4 = local_48;
          goto LAB_00358f01;
        }
      }
      else if (cVar1 == '\0') {
        if (local_48 < pcVar4 + lVar8) {
          FString::AppendCStrPart(command,local_48,(size_t)(pcVar4 + (lVar8 - (long)local_48)));
        }
        FString::UnlockBuffer((FString *)local_38);
        return (FString)(char *)command;
      }
      if (cVar1 != '%') goto LAB_00358f81;
      if (pcVar4[lVar8 + 1] != '%') break;
      FString::AppendCStrPart(command,tail,(size_t)(pcVar4 + (lVar8 - (long)tail) + 1));
      tail = pcVar7 + 2;
      local_48 = pcVar4 + lVar8 + 2;
      lVar8 = lVar8 + 2;
      pcVar6 = pcVar6 + 2;
      pcVar7 = tail;
    }
    if (pcVar4[lVar8 + 1] == '\"') {
      if (bVar2) {
        bVar2 = false;
      }
      else {
        FString::AppendCStrPart(command,local_48,(size_t)(pcVar4 + (lVar8 - (long)local_48)));
        local_48 = pcVar4 + lVar8 + 1;
        bVar2 = true;
      }
LAB_00358f9f:
      pcVar4 = pcVar4 + lVar8 + 2;
      goto LAB_00358f01;
    }
LAB_00358f81:
    if (cVar1 != '\"') {
      if ((cVar1 != '\\') || (pcVar4[lVar8 + 1] != '\"')) {
        pcVar4 = pcVar4 + lVar8 + 1;
        goto LAB_00358f01;
      }
      goto LAB_00358f9f;
    }
    if (!bVar2) {
      do {
        cVar1 = *pcVar6;
        if (cVar1 == '\"') {
          if (pcVar6[-1] != '\\') goto LAB_00359067;
        }
        else if (cVar1 == '\0') goto LAB_00359067;
        pcVar6 = pcVar6 + 1;
      } while( true );
    }
    pcVar4 = pcVar4 + lVar8 + 1;
  } while( true );
LAB_00359067:
  pcVar4 = pcVar6 + 1;
  if (cVar1 == '\0') {
    pcVar4 = pcVar6;
  }
  goto LAB_00358f01;
}

Assistant:

FString SubstituteAliasParams (FString &command, FCommandLine &args)
{
	// Do substitution by replacing %x with the argument x.
	// If there is no argument x, then %x is simply removed.

	// For some reason, strtoul's stop parameter is non-const.
	char *p = command.LockBuffer(), *start = p;
	unsigned long argnum;
	FString buf;
	bool inquote = false;

	while (*p != '\0')
	{
		if (p[0] == '%' && ((p[1] >= '0' && p[1] <= '9') || p[1] == '{'))
		{
			// Do a substitution. Output what came before this.
			buf.AppendCStrPart (start, p - start);

			// Extract the argument number and substitute the corresponding argument.
			argnum = strtoul (p + 1 + (p[1] == '{'), &start, 10);
			if ((p[1] != '{' || *start == '}') && argnum < (unsigned long)args.argc())
			{
				buf += args[argnum];
			}
			p = (start += (p[1] == '{' && *start == '}'));
		}
		else if (p[0] == '%' && p[1] == '%')
		{
			// Do not substitute. Just collapse to a single %.
			buf.AppendCStrPart (start, p - start + 1);
			start = p = p + 2;
			continue;
		}
		else if (p[0] == '%' && p[1] == '"')
		{
			// Collapse %" to " and remember that we're in a quote so when we
			// see a " character again, we don't start skipping below.
			if (!inquote)
			{
				inquote = true;
				buf.AppendCStrPart(start, p - start);
				start = p + 1;
			}
			else
			{
				inquote = false;
			}
			p += 2;
		}
		else if (p[0] == '\\' && p[1] == '"')
		{
			p += 2;
		}
		else if (p[0] == '"')
		{
			// Don't substitute inside quoted strings if it didn't start
			// with a %"
			if (!inquote)
			{
				p++;
				while (*p != '\0' && (*p != '"' || *(p-1) == '\\'))
					p++;
				if (*p != '\0')
					p++;
			}
			else
			{
				inquote = false;
				p++;
			}
		}
		else
		{
			p++;
		}
	}
	// Return whatever was after the final substitution.
	if (p > start)
	{
		buf.AppendCStrPart (start, p - start);
	}
	command.UnlockBuffer();

	return buf;
}